

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Ntk_t * Abc_SclUnBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pObj;
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtk_00;
  int iVar4;
  long lVar5;
  int i;
  int local_40;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntStart(pNtk->vObjs->nSize);
    pNtk->vPhases = pVVar3;
    local_40 = 0;
    iVar4 = 0;
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pNode = Abc_NtkObj(pNtk,i);
      if ((pNode != (Abc_Obj_t *)0x0) &&
         ((uVar1 = *(uint *)&pNode->field_0x14 & 0xf, uVar1 - 3 < 2 ||
          ((uVar1 == 7 && ((pNode->vFanins).nSize != 1)))))) {
        for (lVar5 = 0; lVar5 < (pNode->vFanins).nSize; lVar5 = lVar5 + 1) {
          pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
          uVar1 = Abc_SclGetRealFaninLit(pObj);
          pFanin = Abc_NtkObj(pNtk,uVar1 >> 1);
          if (pFanin != pObj) {
            iVar2 = Abc_NodeFindFanin(pNode,pFanin);
            if (iVar2 < 0) {
              Abc_ObjPatchFanin(pNode,pObj,pFanin);
              if ((uVar1 & 1) != 0) {
                Abc_ObjFaninFlipPhase(pNode,(int)lVar5);
                local_40 = local_40 + 1;
              }
            }
          }
        }
        iVar4 = iVar4 + (int)lVar5;
      }
    }
    if (fVerbose != 0) {
      printf("Saved %d (%.2f %%) fanin phase bits.  ",((double)local_40 * 100.0) / (double)iVar4);
    }
    pNtk_00 = Abc_NtkDupDfs(pNtk);
    if (fVerbose != 0) {
      uVar1 = Abc_SclCountMaxPhases(pNtk_00);
      printf("Max depth = %d.\n",(ulong)uVar1);
    }
    Abc_SclReportDupFanins(pNtk_00);
    return pNtk_00;
  }
  __assert_fail("pNtk->vPhases == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0xf4,"Abc_Ntk_t *Abc_SclUnBufferPhase(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, Counter = 0, Total = 0;
    assert( pNtk->vPhases == NULL );
    pNtk->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( Abc_SclObjIsBufInv(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( pFaninNew == pFanin )
                continue;
            // skip fanins which are already fanins of the node
            if ( Abc_NodeFindFanin( pObj, pFaninNew ) >= 0 )
                continue;
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            if ( Abc_LitIsCompl(iLit) )
                Abc_ObjFaninFlipPhase( pObj, k ), Counter++;
        }
    }
    if ( fVerbose )
        printf( "Saved %d (%.2f %%) fanin phase bits.  ", Counter, 100.0 * Counter / Total );
    // duplicate network in topo order
    pNtkNew = Abc_NtkDupDfs( pNtk );
    if ( fVerbose )
        printf( "Max depth = %d.\n", Abc_SclCountMaxPhases(pNtkNew) );
    Abc_SclReportDupFanins( pNtkNew );
    return pNtkNew;
}